

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLSafe.cxx
# Opt level: O1

ostream * operator<<(ostream *os,cmXMLSafe *self)

{
  byte bVar1;
  byte *pbVar2;
  size_t sVar3;
  char *pcVar4;
  long lVar5;
  char *pcVar6;
  byte *first;
  byte *last;
  uint ch;
  char buf [16];
  uint local_54;
  cmXMLSafe *local_50;
  char local_48 [24];
  
  if (self->Size != 0) {
    first = (byte *)self->Data;
    last = first + self->Size;
    local_50 = self;
    do {
      pbVar2 = (byte *)cm_utf8_decode_character((char *)first,(char *)last,&local_54);
      if (pbVar2 == (byte *)0x0) {
        local_54 = (uint)*first;
        sprintf(local_48,"%X");
        std::__ostream_insert<char,std::char_traits<char>>(os,"[NON-UTF-8-BYTE-0x",0x12);
        sVar3 = strlen(local_48);
        std::__ostream_insert<char,std::char_traits<char>>(os,local_48,sVar3);
        std::__ostream_insert<char,std::char_traits<char>>(os,"]",1);
        pbVar2 = first + 1;
      }
      else if (((local_54 - 0x10000 < 0x100000) || (local_54 - 0x20 < 0xd7e0)) ||
              (local_54 - 0xe000 < 0x1ffe)) {
        if ((int)local_54 < 0x27) {
          if (local_54 == 0xd) goto LAB_00369d04;
          if (local_54 != 0x22) {
            if (local_54 == 0x26) {
              lVar5 = 5;
              pcVar6 = "&amp;";
              goto LAB_00369cff;
            }
            goto LAB_00369b80;
          }
          bVar1 = local_50->DoQuotes;
          pcVar6 = "\"";
          pcVar4 = "&quot;";
        }
        else {
          if (local_54 != 0x27) {
            if (local_54 == 0x3c) {
              lVar5 = 4;
              pcVar6 = "&lt;";
            }
            else {
              if (local_54 != 0x3e) goto LAB_00369b80;
              lVar5 = 4;
              pcVar6 = "&gt;";
            }
            goto LAB_00369cff;
          }
          bVar1 = local_50->DoQuotes;
          pcVar6 = "\'";
          pcVar4 = "&apos;";
        }
        if ((ulong)bVar1 != 0) {
          pcVar6 = pcVar4;
        }
        lVar5 = (ulong)bVar1 * 5 + 1;
LAB_00369cff:
        std::__ostream_insert<char,std::char_traits<char>>(os,pcVar6,lVar5);
      }
      else if (local_54 - 9 < 2) {
LAB_00369b80:
        std::ostream::write((char *)os,(long)first);
      }
      else if (local_54 != 0xd) {
        sprintf(local_48,"%X");
        std::__ostream_insert<char,std::char_traits<char>>(os,"[NON-XML-CHAR-0x",0x10);
        sVar3 = strlen(local_48);
        std::__ostream_insert<char,std::char_traits<char>>(os,local_48,sVar3);
        lVar5 = 1;
        pcVar6 = "]";
        goto LAB_00369cff;
      }
LAB_00369d04:
      first = pbVar2;
    } while (first != last);
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, cmXMLSafe const& self)
{
  char const* first = self.Data;
  char const* last = self.Data + self.Size;
  while (first != last) {
    unsigned int ch;
    if (const char* next = cm_utf8_decode_character(first, last, &ch)) {
      // http://www.w3.org/TR/REC-xml/#NT-Char
      if ((ch >= 0x20 && ch <= 0xD7FF) || (ch >= 0xE000 && ch <= 0xFFFD) ||
          (ch >= 0x10000 && ch <= 0x10FFFF) || ch == 0x9 || ch == 0xA ||
          ch == 0xD) {
        switch (ch) {
          // Escape XML control characters.
          case '&':
            os << "&amp;";
            break;
          case '<':
            os << "&lt;";
            break;
          case '>':
            os << "&gt;";
            break;
          case '"':
            os << (self.DoQuotes ? "&quot;" : "\"");
            break;
          case '\'':
            os << (self.DoQuotes ? "&apos;" : "'");
            break;
          case '\r':
            break; // Ignore CR
          // Print the UTF-8 character.
          default:
            os.write(first, next - first);
            break;
        }
      } else {
        // Use a human-readable hex value for this invalid character.
        char buf[16];
        sprintf(buf, "%X", ch);
        os << "[NON-XML-CHAR-0x" << buf << "]";
      }

      first = next;
    } else {
      ch = static_cast<unsigned char>(*first++);
      // Use a human-readable hex value for this invalid byte.
      char buf[16];
      sprintf(buf, "%X", ch);
      os << "[NON-UTF-8-BYTE-0x" << buf << "]";
    }
  }
  return os;
}